

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> * __thiscall
rangeless::fn::impl::take_while<rangeless::fn::impl::call_count_lt>::operator()
          (vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           *__return_storage_ptr__,take_while<rangeless::fn::impl::call_count_lt> *this,
          vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *cont)

{
  pointer pXVar1;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  __first;
  
  __first = std::
            __find_if<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>,__gnu_cxx::__ops::_Iter_negate<rangeless::fn::impl::call_count_lt>>
                      ((cont->
                       super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (cont->
                       super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                       )._M_impl.super__Vector_impl_data._M_finish,(this->pred).cap,
                       (this->pred).num_calls);
  std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::erase
            (cont,(const_iterator)__first._M_current,
             (cont->
             super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  pXVar1 = (cont->
           super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (cont->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_finish = pXVar1;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (cont->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (cont->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (cont->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (cont->super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Container operator()(Container cont) const
        {
            auto it = std::find_if_not(cont.begin(), cont.end(), pred);
            cont.erase(it, cont.end()); 
            return cont;
        }